

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void __thiscall
QListModeViewBase::scrollContentsBy(QListModeViewBase *this,int dx,int dy,bool scrollElasticBand)

{
  QListViewPrivate *pQVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  ScrollMode SVar7;
  ScrollMode SVar8;
  QScrollBar *pQVar9;
  uint uVar10;
  
  pQVar9 = QAbstractScrollArea::verticalScrollBar
                     ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
  uVar5 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
  pQVar9 = QAbstractScrollArea::horizontalScrollBar
                     ((QAbstractScrollArea *)(this->super_QCommonListViewBase).qq);
  uVar6 = QAbstractSlider::value(&pQVar9->super_QAbstractSlider);
  SVar7 = QAbstractItemView::verticalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  SVar8 = QAbstractItemView::horizontalScrollMode
                    ((QAbstractItemView *)(this->super_QCommonListViewBase).qq);
  pQVar1 = (this->super_QCommonListViewBase).dd;
  if (pQVar1->wrap == true) {
    lVar2 = (this->segmentPositions).d.size;
    if (lVar2 == 0) {
      return;
    }
    uVar10 = (int)lVar2 - 1;
    if (((SVar8 == ScrollPerItem) && (dx != 0)) && (pQVar1->flow == TopToBottom)) {
      if ((int)uVar10 < (int)uVar6) {
        uVar6 = uVar10;
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      uVar5 = dx + uVar6;
      if ((int)uVar10 < (int)(dx + uVar6)) {
        uVar5 = uVar10;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      piVar3 = (this->segmentPositions).d.ptr;
      dx = piVar3[uVar5] - piVar3[uVar6];
    }
    else if (((SVar7 == ScrollPerItem) && (dy != 0)) && (pQVar1->flow == LeftToRight)) {
      if ((int)uVar10 < (int)uVar5) {
        uVar5 = uVar10;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      uVar6 = dy + uVar5;
      if ((int)uVar10 < (int)(dy + uVar5)) {
        uVar6 = uVar10;
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      piVar3 = (this->segmentPositions).d.ptr;
      dy = piVar3[uVar6] - piVar3[uVar5];
    }
  }
  else {
    if ((this->flowPositions).d.size == 0) {
      return;
    }
    uVar10 = (int)(this->scrollValueMap).d.size - 1;
    if (((SVar7 == ScrollPerItem) && (dy != 0)) && (pQVar1->flow == TopToBottom)) {
      if ((int)uVar10 < (int)uVar5) {
        uVar5 = uVar10;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      uVar6 = dy + uVar5;
      if ((int)uVar10 < (int)(dy + uVar5)) {
        uVar6 = uVar10;
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      piVar3 = (this->flowPositions).d.ptr;
      piVar4 = (this->scrollValueMap).d.ptr;
      dy = piVar3[piVar4[uVar6]] - piVar3[piVar4[uVar5]];
    }
    else if (((SVar8 == ScrollPerItem) && (dx != 0)) && (pQVar1->flow == LeftToRight)) {
      if ((int)uVar10 < (int)uVar6) {
        uVar6 = uVar10;
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      uVar5 = dx + uVar6;
      if ((int)uVar10 < (int)(dx + uVar6)) {
        uVar5 = uVar10;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      piVar3 = (this->flowPositions).d.ptr;
      piVar4 = (this->scrollValueMap).d.ptr;
      dx = piVar3[piVar4[uVar5]] - piVar3[piVar4[uVar6]];
    }
  }
  QCommonListViewBase::scrollContentsBy(&this->super_QCommonListViewBase,dx,dy,false);
  return;
}

Assistant:

void QListModeViewBase::scrollContentsBy(int dx, int dy, bool scrollElasticBand)
{
    // ### reorder this logic
    const int verticalValue = verticalScrollBar()->value();
    const int horizontalValue = horizontalScrollBar()->value();
    const bool vertical = (verticalScrollMode() == QAbstractItemView::ScrollPerItem);
    const bool horizontal = (horizontalScrollMode() == QAbstractItemView::ScrollPerItem);

    if (isWrapping()) {
        if (segmentPositions.isEmpty())
            return;
        const int max = segmentPositions.size() - 1;
        if (horizontal && flow() == QListView::TopToBottom && dx != 0) {
            int currentValue = qBound(0, horizontalValue, max);
            int previousValue = qBound(0, currentValue + dx, max);
            int currentCoordinate = segmentPositions.at(currentValue) - spacing();
            int previousCoordinate = segmentPositions.at(previousValue) - spacing();
            dx = previousCoordinate - currentCoordinate;
        } else if (vertical && flow() == QListView::LeftToRight && dy != 0) {
            int currentValue = qBound(0, verticalValue, max);
            int previousValue = qBound(0, currentValue + dy, max);
            int currentCoordinate = segmentPositions.at(currentValue) - spacing();
            int previousCoordinate = segmentPositions.at(previousValue) - spacing();
            dy = previousCoordinate - currentCoordinate;
        }
    } else {
        if (flowPositions.isEmpty())
            return;
        const int max = scrollValueMap.size() - 1;
        if (vertical && flow() == QListView::TopToBottom && dy != 0) {
            int currentValue = qBound(0, verticalValue, max);
            int previousValue = qBound(0, currentValue + dy, max);
            int currentCoordinate = flowPositions.at(scrollValueMap.at(currentValue));
            int previousCoordinate = flowPositions.at(scrollValueMap.at(previousValue));
            dy = previousCoordinate - currentCoordinate;
        } else if (horizontal && flow() == QListView::LeftToRight && dx != 0) {
            int currentValue = qBound(0, horizontalValue, max);
            int previousValue = qBound(0, currentValue + dx, max);
            int currentCoordinate = flowPositions.at(scrollValueMap.at(currentValue));
            int previousCoordinate = flowPositions.at(scrollValueMap.at(previousValue));
            dx = previousCoordinate - currentCoordinate;
        }
    }
    QCommonListViewBase::scrollContentsBy(dx, dy, scrollElasticBand);
}